

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

HeapLeafObject * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::findObject
          (Interpreter *this,Identifier *f,HeapObject *curr,uint start_from,uint *counter)

{
  HeapLeafObject *pHVar1;
  long lVar2;
  HeapLeafObject *pHVar3;
  const_iterator cVar4;
  undefined4 in_register_0000000c;
  uint *puVar5;
  uint uVar6;
  Interpreter *local_38;
  
  puVar5 = (uint *)CONCAT44(in_register_0000000c,start_from);
  do {
    if (f == (Identifier *)0x0) {
      uVar6 = *puVar5;
LAB_0018214c:
      *puVar5 = uVar6 + 1;
      return (HeapLeafObject *)0x0;
    }
    lVar2 = __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                           &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
    if (lVar2 == 0) {
      uVar6 = *puVar5;
      if (uVar6 < (uint)curr) goto LAB_0018214c;
      local_38 = this;
      pHVar3 = (HeapLeafObject *)
               __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                              &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
      if (pHVar3 == (HeapLeafObject *)0x0) {
        pHVar3 = (HeapLeafObject *)
                 __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                                &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
        if (pHVar3 == (HeapLeafObject *)0x0) goto LAB_0018214c;
        cVar4._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::find((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                     *)(pHVar3 + 5),(key_type *)&local_38);
        pHVar1 = pHVar3 + 5;
      }
      else {
        cVar4 = std::
                map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                ::find((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                        *)(pHVar3 + 4),(key_type *)&local_38);
        pHVar1 = pHVar3 + 4;
      }
      if (cVar4._M_node != (_Base_ptr)&(pHVar1->super_HeapObject).super_HeapEntity.mark) {
        return pHVar3;
      }
      goto LAB_0018214c;
    }
    pHVar3 = findObject(this,*(Identifier **)(lVar2 + 0x18),(HeapObject *)((ulong)curr & 0xffffffff)
                        ,start_from,counter);
    if (pHVar3 != (HeapLeafObject *)0x0) {
      return pHVar3;
    }
    f = *(Identifier **)(lVar2 + 0x10);
  } while( true );
}

Assistant:

HeapLeafObject *findObject(const Identifier *f, HeapObject *curr, unsigned start_from,
                               unsigned &counter)
    {
        if (auto *ext = dynamic_cast<HeapExtendedObject *>(curr)) {
            auto *r = findObject(f, ext->right, start_from, counter);
            if (r)
                return r;
            auto *l = findObject(f, ext->left, start_from, counter);
            if (l)
                return l;
        } else {
            if (counter >= start_from) {
                if (auto *simp = dynamic_cast<HeapSimpleObject *>(curr)) {
                    auto it = simp->fields.find(f);
                    if (it != simp->fields.end()) {
                        return simp;
                    }
                } else if (auto *comp = dynamic_cast<HeapComprehensionObject *>(curr)) {
                    auto it = comp->compValues.find(f);
                    if (it != comp->compValues.end()) {
                        return comp;
                    }
                }
            }
            counter++;
        }
        return nullptr;
    }